

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

_Bool xpk_list(XPK *xpk)

{
  XPKEntry *entry;
  int local_14;
  int i;
  XPK *xpk_local;
  
  printf("%d entry(ies):\n",(ulong)xpk->n_entries);
  for (local_14 = 0; local_14 < (int)(uint)xpk->n_entries; local_14 = local_14 + 1) {
    printf("\t");
    entry = XPK_EntryAtIndex(xpk,local_14);
    XPKEntry_Pretty(entry);
  }
  return true;
}

Assistant:

static bool
xpk_list(const XPK *xpk)
{
	printf("%d entry(ies):\n", xpk->n_entries);
	for (int i = 0; i < xpk->n_entries; i++) {
		printf("\t");
		XPKEntry_Pretty(XPK_EntryAtIndex(xpk, i));
	}
	return true;
}